

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::udivrem(APInt *LHS,uint64_t RHS,APInt *Quotient,uint64_t *Remainder)

{
  uint NewBitWidth;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uStack_50;
  APInt AStack_48;
  uint64_t RHS_local;
  
  RHS_local = RHS;
  if (RHS == 0) {
    __assert_fail("RHS != 0 && \"Divide by zero?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x6fc,
                  "static void llvm::APInt::udivrem(const APInt &, uint64_t, APInt &, uint64_t &)");
  }
  NewBitWidth = LHS->BitWidth;
  if ((ulong)NewBitWidth < 0x41) {
    uVar3 = (LHS->U).VAL / RHS;
    *Remainder = (LHS->U).VAL % RHS;
LAB_0019dc6a:
    APInt(&AStack_48,NewBitWidth,uVar3,false);
    operator=(Quotient,&AStack_48);
    ~APInt(&AStack_48);
    return;
  }
  uVar2 = getActiveBits(LHS);
  if (uVar2 == 0) {
    uStack_50 = 0;
  }
  else {
    if (RHS == 1) {
      operator=(Quotient,LHS);
      goto LAB_0019dcca;
    }
    bVar1 = ult(LHS,RHS);
    if (bVar1) {
      uVar4 = getZExtValue(LHS);
      *Remainder = uVar4;
      uVar3 = 0;
      goto LAB_0019dc6a;
    }
    bVar1 = operator==(LHS,RHS);
    if (!bVar1) {
      reallocate(Quotient,NewBitWidth);
      uVar2 = (uint)((ulong)uVar2 + 0x3f >> 6);
      if (uVar2 == 1) {
        uVar3 = *(LHS->U).pVal;
        operator=(Quotient,uVar3 / RHS);
        *Remainder = uVar3 % RHS;
        return;
      }
      divide((LHS->U).pVal,uVar2,&RHS_local,1,(Quotient->U).pVal,Remainder);
      memset((void *)((ulong)(uVar2 * 8) + (long)(Quotient->U).pVal),0,
             (ulong)(((int)((ulong)NewBitWidth + 0x3f >> 6) - uVar2) * 8));
      return;
    }
    uStack_50 = 1;
  }
  APInt(&AStack_48,NewBitWidth,uStack_50,false);
  operator=(Quotient,&AStack_48);
  ~APInt(&AStack_48);
LAB_0019dcca:
  *Remainder = 0;
  return;
}

Assistant:

void APInt::udivrem(const APInt &LHS, uint64_t RHS, APInt &Quotient,
                    uint64_t &Remainder) {
  assert(RHS != 0 && "Divide by zero?");
  unsigned BitWidth = LHS.BitWidth;

  // First, deal with the easy case
  if (LHS.isSingleWord()) {
    uint64_t QuotVal = LHS.U.VAL / RHS;
    Remainder = LHS.U.VAL % RHS;
    Quotient = APInt(BitWidth, QuotVal);
    return;
  }

  // Get some size facts about the dividend and divisor
  unsigned lhsWords = getNumWords(LHS.getActiveBits());

  // Check the degenerate cases
  if (lhsWords == 0) {
    Quotient = APInt(BitWidth, 0);    // 0 / Y ===> 0
    Remainder = 0;                    // 0 % Y ===> 0
    return;
  }

  if (RHS == 1) {
    Quotient = LHS;                   // X / 1 ===> X
    Remainder = 0;                    // X % 1 ===> 0
    return;
  }

  if (LHS.ult(RHS)) {
    Remainder = LHS.getZExtValue();   // X % Y ===> X, iff X < Y
    Quotient = APInt(BitWidth, 0);    // X / Y ===> 0, iff X < Y
    return;
  }

  if (LHS == RHS) {
    Quotient  = APInt(BitWidth, 1);   // X / X ===> 1
    Remainder = 0;                    // X % X ===> 0;
    return;
  }

  // Make sure there is enough space to hold the results.
  // NOTE: This assumes that reallocate won't affect any bits if it doesn't
  // change the size. This is necessary if Quotient is aliased with LHS.
  Quotient.reallocate(BitWidth);

  if (lhsWords == 1) { // rhsWords is 1 if lhsWords is 1.
    // There is only one word to consider so use the native versions.
    uint64_t lhsValue = LHS.U.pVal[0];
    Quotient = lhsValue / RHS;
    Remainder = lhsValue % RHS;
    return;
  }

  // Okay, lets do it the long way
  divide(LHS.U.pVal, lhsWords, &RHS, 1, Quotient.U.pVal, &Remainder);
  // Clear the rest of the Quotient.
  std::memset(Quotient.U.pVal + lhsWords, 0,
              (getNumWords(BitWidth) - lhsWords) * APINT_WORD_SIZE);
}